

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
__thiscall
duckdb::Connection::PendingQuery
          (Connection *this,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement,vector<duckdb::Value,_true> *values,bool allow_stream_result)

{
  shared_ptr<duckdb::ClientContext,_true> *in_RDX;
  unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_> in_RDI;
  byte in_R8B;
  case_insensitive_map_t<BoundParameterData> named_params;
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> local_78 [10];
  byte local_21;
  
  local_21 = in_R8B & 1;
  ConvertParamListToMap_abi_cxx11_
            ((vector<duckdb::Value,_true> *)named_params._M_h._M_before_begin._M_nxt);
  shared_ptr<duckdb::ClientContext,_true>::operator->(in_RDX);
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::unique_ptr
            ((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             in_RDX,local_78);
  ClientContext::PendingQuery
            ((ClientContext *)this,statement,(case_insensitive_map_t<BoundParameterData> *)values,
             allow_stream_result);
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::~unique_ptr
            ((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             0x87f5c9);
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
                    *)0x87f5d3);
  return (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         (__uniq_ptr_impl<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
          )in_RDI._M_t.
           super___uniq_ptr_impl<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
           .super__Head_base<0UL,_duckdb::PendingQueryResult_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<PendingQueryResult> Connection::PendingQuery(unique_ptr<SQLStatement> statement, vector<Value> &values,
                                                        bool allow_stream_result) {
	auto named_params = ConvertParamListToMap(values);
	return context->PendingQuery(std::move(statement), named_params, allow_stream_result);
}